

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_band.c
# Opt level: O1

void bandGBTRS(realtype **a,sunindextype n,sunindextype smu,sunindextype ml,sunindextype *p,
              realtype *b)

{
  long lVar1;
  realtype *prVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  realtype *prVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  
  lVar4 = n + -1;
  if (1 < n) {
    prVar6 = b + 1;
    lVar5 = 0;
    do {
      lVar7 = p[lVar5];
      dVar9 = b[lVar7];
      if (lVar7 != lVar5) {
        b[lVar7] = b[lVar5];
        b[lVar5] = dVar9;
      }
      lVar7 = lVar5 + ml;
      if (n <= lVar5 + ml) {
        lVar7 = lVar4;
      }
      if (lVar5 < lVar7) {
        prVar2 = a[lVar5];
        lVar8 = 0;
        do {
          prVar6[lVar8] = prVar2[smu + lVar8 + 1] * dVar9 + prVar6[lVar8];
          lVar1 = lVar5 + lVar8;
          lVar8 = lVar8 + 1;
        } while (lVar1 + 1 < lVar7);
      }
      lVar5 = lVar5 + 1;
      prVar6 = prVar6 + 1;
    } while (lVar5 != lVar4);
  }
  if (0 < n) {
    lVar5 = smu * 8 + n * -8;
    do {
      lVar5 = lVar5 + 8;
      prVar6 = a[lVar4];
      lVar7 = lVar4 - smu;
      if (lVar4 - smu < 1) {
        lVar7 = 0;
      }
      dVar9 = b[lVar4] / prVar6[smu];
      b[lVar4] = dVar9;
      if (lVar7 < lVar4) {
        do {
          b[lVar7] = *(double *)((long)prVar6 + lVar7 * 8 + lVar5) * -dVar9 + b[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 < lVar4);
      }
      bVar3 = 0 < lVar4;
      lVar4 = lVar4 + -1;
    } while (bVar3);
  }
  return;
}

Assistant:

void bandGBTRS(realtype **a, sunindextype n, sunindextype smu, sunindextype ml, sunindextype *p, realtype *b)
{
  sunindextype k, l, i, first_row_k, last_row_k;
  realtype mult, *diag_k;
  
  /* Solve Ly = Pb, store solution y in b */
  
  for (k=0; k < n-1; k++) {
    l = p[k];
    mult = b[l];
    if (l != k) {
      b[l] = b[k];
      b[k] = mult;
    }
    diag_k = a[k]+smu;
    last_row_k = SUNMIN(n-1,k+ml);
    for (i=k+1; i <= last_row_k; i++)
      b[i] += mult * diag_k[i-k];
  }
  
  /* Solve Ux = y, store solution x in b */
  
  for (k=n-1; k >= 0; k--) {
    diag_k = a[k]+smu;
    first_row_k = SUNMAX(0,k-smu);
    b[k] /= (*diag_k);
    mult = -b[k];
    for (i=first_row_k; i <= k-1; i++)
      b[i] += mult*diag_k[i-k];
  }
}